

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

void __thiscall
soul::SourceCodeUtilities::findASTObjectAt(soul::AST::ASTObject&,soul::CodeLocation)::
FindLocationVisitor::visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  char *pcVar1;
  char *pcVar2;
  ASTObject *pAVar3;
  long lVar4;
  
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  pcVar1 = *(char **)((long)this + 8);
  pcVar2 = (o->context).location.location.data;
  lVar4 = (long)pcVar1 - (long)pcVar2;
  if (pcVar1 != pcVar2) {
    if (lVar4 < 1) {
      return;
    }
    if (*(long *)((long)this + 0x10) == 0) {
      return;
    }
    pAVar3 = pool_ptr<soul::AST::ASTObject>::operator->
                       ((pool_ptr<soul::AST::ASTObject> *)((long)this + 0x10));
    if ((long)pcVar1 - (long)(pAVar3->context).location.location.data <= lVar4) {
      return;
    }
  }
  *(ASTObject **)((long)this + 0x10) = o;
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }